

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void gai_mem_copy(int elemsize,int ndim,void *src_ptr,Integer *src_start,Integer *count,
                 Integer *src_ld,void *dst_ptr,Integer *dst_start,Integer *dst_ld)

{
  undefined8 uVar1;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  int in_EDI;
  undefined8 *in_R8;
  long in_R9;
  long in_stack_00000008;
  int segsize;
  int dst_stride [7];
  int src_stride [7];
  int dst_bunit [7];
  int dst_bvalue [7];
  int src_bunit [7];
  int src_bvalue [7];
  int n1dim;
  long dst_idx;
  long src_idx;
  int j;
  int i;
  void *dptr;
  void *sptr;
  Integer factor;
  Integer dst_offset;
  Integer src_offset;
  int local_128 [8];
  int local_108 [8];
  int local_e8 [8];
  int local_c8 [8];
  int local_a8 [8];
  int local_88 [7];
  int local_6c;
  long local_68;
  long local_60;
  int local_58;
  int local_54;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  undefined8 *local_20;
  int local_8;
  
  local_40 = 1;
  local_30 = 0;
  for (local_54 = 0; local_54 < in_ESI; local_54 = local_54 + 1) {
    local_30 = *(long *)(in_RCX + (long)local_54 * 8) * local_40 + local_30;
    if (local_54 < in_ESI + -1) {
      local_40 = *(long *)(in_R9 + (long)local_54 * 8) * local_40;
    }
  }
  local_48 = in_RDX + local_30 * in_EDI;
  local_40 = 1;
  local_38 = 0;
  for (local_54 = 0; local_54 < in_ESI; local_54 = local_54 + 1) {
    local_38 = *(long *)(dst_stride._0_8_ + (long)local_54 * 8) * local_40 + local_38;
    if (local_54 < in_ESI + -1) {
      local_40 = *(long *)(dst_stride._8_8_ + (long)local_54 * 8) * local_40;
    }
  }
  local_50 = in_stack_00000008 + local_38 * in_EDI;
  uVar1 = *in_R8;
  local_6c = 1;
  local_28 = in_R9;
  local_20 = in_R8;
  local_8 = in_ESI;
  for (local_54 = 0; local_54 < local_8 + -1; local_54 = local_54 + 1) {
    local_108[local_54 + 1] = local_108[local_54];
    local_108[local_54 + 1] =
         (int)*(undefined8 *)(local_28 + (long)local_54 * 8) * local_108[local_54 + 1];
    local_128[local_54 + 1] = local_128[local_54];
    local_128[local_54 + 1] =
         (int)*(undefined8 *)(dst_stride._8_8_ + (long)local_54 * 8) * local_128[local_54 + 1];
  }
  for (local_54 = 1; local_54 <= local_8 + -1; local_54 = local_54 + 1) {
    local_6c = local_6c * (int)local_20[local_54];
  }
  local_88[0] = 0;
  local_88[1] = 0;
  local_a8[0] = 1;
  local_a8[1] = 1;
  local_c8[0] = 0;
  local_c8[1] = 0;
  local_e8[0] = 1;
  local_e8[1] = 1;
  for (local_54 = 2; local_54 <= local_8 + -1; local_54 = local_54 + 1) {
    local_88[local_54] = 0;
    local_c8[local_54] = 0;
    local_a8[local_54] = local_a8[local_54 + -1] * (int)local_20[local_54 + -1];
    local_e8[local_54] = local_e8[local_54 + -1] * (int)local_20[local_54 + -1];
  }
  for (local_54 = 0; local_54 < local_6c; local_54 = local_54 + 1) {
    local_60 = 0;
    local_68 = 0;
    for (local_58 = 1; local_58 <= local_8 + -1; local_58 = local_58 + 1) {
      local_60 = local_88[local_58] * local_108[local_58] + local_60;
      if ((local_54 + 1) % local_a8[local_58] == 0) {
        local_88[local_58] = local_88[local_58] + 1;
      }
      if (local_20[local_58] + -1 < (long)local_88[local_58]) {
        local_88[local_58] = 0;
      }
    }
    for (local_58 = 1; local_58 <= local_8 + -1; local_58 = local_58 + 1) {
      local_68 = local_c8[local_58] * local_128[local_58] + local_68;
      if ((local_54 + 1) % local_e8[local_58] == 0) {
        local_c8[local_58] = local_c8[local_58] + 1;
      }
      if (local_20[local_58] + -1 < (long)local_c8[local_58]) {
        local_c8[local_58] = 0;
      }
    }
    memcpy((void *)(local_50 + local_68),(void *)(local_48 + local_60),(long)((int)uVar1 * in_EDI));
  }
  return;
}

Assistant:

void gai_mem_copy(int elemsize, int ndim, void *src_ptr, Integer *src_start,
    Integer *count,  Integer *src_ld, void *dst_ptr, Integer *dst_start,
    Integer *dst_ld)
{
  Integer src_offset, dst_offset;
  Integer factor;
  void *sptr, *dptr;
  int i, j;
  long src_idx, dst_idx;
  int n1dim; /* total number of contiguous segments */
  int src_bvalue[MAXDIM], src_bunit[MAXDIM];
  int dst_bvalue[MAXDIM], dst_bunit[MAXDIM];
  int src_stride[MAXDIM], dst_stride[MAXDIM];
  int segsize;
  /* find offsets for both source and destination buffers and use these to
   * adjust pointers to the first element in each data set
   */
  factor = 1;
  src_offset = 0;
  for (i=0; i<ndim; i++) {
    src_offset += src_start[i]*factor;
    if (i<ndim-1) factor *= src_ld[i];
  }
  sptr = (void*)((char*)src_ptr+src_offset*elemsize);

  factor = 1; //reset the factor

  dst_offset = 0;
  for (i=0; i<ndim; i++) {
    dst_offset += dst_start[i]*factor;
    if (i<ndim-1) factor *= dst_ld[i];
  }
  dptr = (void*)((char*)dst_ptr+dst_offset*elemsize);
  segsize = count[0]*elemsize;
  /* perform the memcpy from source to destination buffer. Start by calculating
   * the total number of contiguous segments in the src array*/
  n1dim = 1;

  src_stride[0] = dst_stride[0] = elemsize;
  for (i=0; i<ndim-1; i++) {
    src_stride[i+1] = src_stride[i];
    src_stride[i+1] *= (int)src_ld[i];
    dst_stride[i+1] = dst_stride[i];
    dst_stride[i+1] *= (int)dst_ld[i];
  }

  for (i=1; i<=ndim-1; i++) {
    n1dim *= count[i];
  }
  /* initialize arrays for evaluating offset of each segment */
  src_bvalue[0] = 0;
  src_bvalue[1] = 0;
  src_bunit[0] = 1;
  src_bunit[1] = 1;
  dst_bvalue[0] = 0;
  dst_bvalue[1] = 0;
  dst_bunit[0] = 1;
  dst_bunit[1] = 1;

  //this part does nothing?
  for (i=2; i<=ndim-1; i++) {
    src_bvalue[i] = 0;
    dst_bvalue[i] = 0;
    src_bunit[i] = src_bunit[i-1]*count[i-1];
    dst_bunit[i] = dst_bunit[i-1]*count[i-1];
  }

  /* evaluate offset for each contiguous segment */
  for (i=0; i<n1dim; i++) {
    src_idx = 0;
    dst_idx = 0;
    for (j=1; j<=ndim-1; j++) {
      src_idx += src_bvalue[j]*src_stride[j];
      if ((i+1)%src_bunit[j] == 0) {
        src_bvalue[j]++;
      }
      if (src_bvalue[j] > (count[j]-1)) {
        src_bvalue[j] = 0;
      }
    }
    for (j=1; j<=ndim-1; j++) {
      dst_idx += dst_bvalue[j]*dst_stride[j];
      if ((i+1)%dst_bunit[j] == 0) {
        dst_bvalue[j]++;
      }
      if (dst_bvalue[j] > (count[j]-1)) {
        dst_bvalue[j] = 0;
      }
    }
    /* copy memory */
    memcpy((char*)dptr+dst_idx,(char*)sptr+src_idx,segsize);
  }
}